

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS
ref_interp_exhaustive_tet_around_node
          (REF_INTERP ref_interp,REF_INT node,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT cell_00;
  ulong uVar4;
  char *pcVar5;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS RVar6;
  double dVar7;
  REF_DBL RVar8;
  undefined8 uStack_100;
  int local_f8;
  uint local_f4;
  double local_f0;
  REF_DBL current_bary [4];
  REF_INT nodes [27];
  
  ref_cell = ref_interp->from_tet;
  local_f8 = -1;
  uVar4 = 0xffffffff;
  cell_00 = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar4 = 0xffffffff;
    cell_00 = -1;
    if (node < pRVar1->nnode) {
      uVar3 = pRVar1->first[(uint)node];
      uVar4 = 0xffffffff;
      cell_00 = -1;
      if ((long)(int)uVar3 != -1) {
        cell_00 = pRVar1->item[(int)uVar3].ref;
        uVar4 = (ulong)uVar3;
      }
    }
  }
  ref_node = ref_interp->from_grid->node;
  local_f0 = -999.0;
  do {
    if ((int)uVar4 == -1) {
      if (local_f8 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x45,"ref_interp_exhaustive_tet_around_node","failed to find cell");
        RVar6 = 1;
      }
      else {
        *cell = local_f8;
        uVar3 = ref_cell_nodes(ref_cell,local_f8,nodes);
        if (uVar3 == 0) {
          uVar3 = ref_node_bary4(ref_node,nodes,xyz,bary);
          if (uVar3 == 0) {
            return 0;
          }
          uVar4 = (ulong)uVar3;
          pcVar5 = "bary";
          uStack_100 = 0x49;
        }
        else {
          uVar4 = (ulong)uVar3;
          pcVar5 = "cell";
          uStack_100 = 0x48;
        }
LAB_001185b0:
        RVar6 = (REF_STATUS)uVar4;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uStack_100,"ref_interp_exhaustive_tet_around_node",uVar4,pcVar5);
      }
      return RVar6;
    }
    uVar3 = ref_cell_nodes(ref_cell,cell_00,nodes);
    if (uVar3 != 0) {
      uVar4 = (ulong)uVar3;
      pcVar5 = "cell";
      uStack_100 = 0x38;
      goto LAB_001185b0;
    }
    uVar3 = ref_node_bary4(ref_node,nodes,xyz,current_bary);
    if ((uVar3 & 0xfffffffb) != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x3a
             ,"ref_interp_exhaustive_tet_around_node",(ulong)uVar3,"bary");
      local_f4 = uVar3;
    }
    if (uVar3 != 4) {
      if (uVar3 != 0) {
        return local_f4;
      }
      dVar7 = current_bary[0];
      if (current_bary[1] <= current_bary[0]) {
        dVar7 = current_bary[1];
      }
      RVar8 = current_bary[2];
      if (current_bary[3] <= current_bary[2]) {
        RVar8 = current_bary[3];
      }
      if (RVar8 <= dVar7) {
        dVar7 = RVar8;
      }
      if ((local_f8 == -1) || (local_f0 < dVar7)) {
        local_f8 = cell_00;
        local_f0 = dVar7;
      }
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar4 = (ulong)pRVar2[(int)uVar4].next;
    cell_00 = -1;
    if (uVar4 != 0xffffffffffffffff) {
      cell_00 = pRVar2[uVar4].ref;
    }
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_interp_exhaustive_tet_around_node(
    REF_INTERP ref_interp, REF_INT node, REF_DBL *xyz, REF_INT *cell,
    REF_DBL *bary) {
  REF_CELL ref_cell = ref_interp_from_tet(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, candidate, best_candidate;
  REF_DBL current_bary[4];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_cell_having_node(ref_cell, node, item, candidate) {
    RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
    status = ref_node_bary4(ref_node, nodes, xyz, current_bary);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */
      min_bary = MIN(MIN(current_bary[0], current_bary[1]),
                     MIN(current_bary[2], current_bary[3]));
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find cell");

  *cell = best_candidate;
  RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
  RSS(ref_node_bary4(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}